

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_srtp_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  size_t sVar2;
  int iVar3;
  void *pvVar4;
  byte bVar5;
  byte unaff_BPL;
  uint16_t profile_id;
  CBS profile_ids_tmp;
  CBS profile_ids;
  CBS srtp_mki;
  ushort local_82;
  SSL *local_80;
  size_t local_78;
  OPENSSL_STACK *local_70;
  size_t local_68;
  CBS local_60;
  CBS local_50;
  CBS local_40;
  
  bVar5 = 1;
  if (contents != (CBS *)0x0) {
    local_80 = (SSL *)hs->ssl;
    iVar3 = SSL_is_dtls((SSL *)local_80);
    if (iVar3 != 0) {
      iVar3 = CBS_get_u16_length_prefixed(contents,&local_50);
      if ((((iVar3 == 0) || (local_50.len < 2)) ||
          (iVar3 = CBS_get_u8_length_prefixed(contents,&local_40), iVar3 == 0)) ||
         (contents->len != 0)) {
        ERR_put_error(0x10,0,0x74,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x6c3);
        bVar5 = 0;
      }
      else {
        local_70 = (OPENSSL_STACK *)SSL_get_srtp_profiles(local_80);
        local_78 = OPENSSL_sk_num(local_70);
        bVar5 = 1;
        if (local_78 != 0) {
          local_68 = 0;
          do {
            pvVar4 = OPENSSL_sk_value(local_70,local_68);
            local_60.data = local_50.data;
            local_60.len = local_50.len;
            do {
              sVar2 = local_60.len;
              if (local_60.len == 0) break;
              iVar3 = CBS_get_u16(&local_60,&local_82);
              if (iVar3 == 0) {
                bVar1 = false;
                unaff_BPL = 0;
              }
              else {
                bVar1 = true;
                if (*(ulong *)((long)pvVar4 + 8) == (ulong)local_82) {
                  *(void **)(local_80->handshake_func + 0x280) = pvVar4;
                  unaff_BPL = 1;
                  bVar1 = false;
                }
              }
            } while (bVar1);
            bVar5 = unaff_BPL;
          } while ((sVar2 == 0) && (local_68 = local_68 + 1, bVar5 = 1, local_68 != local_78));
        }
      }
    }
  }
  return (bool)(bVar5 & 1);
}

Assistant:

static bool ext_srtp_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                       CBS *contents) {
  SSL *const ssl = hs->ssl;
  // DTLS-SRTP is only defined for DTLS.
  if (contents == NULL || !SSL_is_dtls(ssl)) {
    return true;
  }

  CBS profile_ids, srtp_mki;
  if (!CBS_get_u16_length_prefixed(contents, &profile_ids) ||
      CBS_len(&profile_ids) < 2 ||
      !CBS_get_u8_length_prefixed(contents, &srtp_mki) ||
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_PROTECTION_PROFILE_LIST);
    return false;
  }
  // Discard the MKI value for now.

  const STACK_OF(SRTP_PROTECTION_PROFILE) *server_profiles =
      SSL_get_srtp_profiles(ssl);

  // Pick the server's most preferred profile.
  for (const SRTP_PROTECTION_PROFILE *server_profile : server_profiles) {
    CBS profile_ids_tmp;
    CBS_init(&profile_ids_tmp, CBS_data(&profile_ids), CBS_len(&profile_ids));

    while (CBS_len(&profile_ids_tmp) > 0) {
      uint16_t profile_id;
      if (!CBS_get_u16(&profile_ids_tmp, &profile_id)) {
        return false;
      }

      if (server_profile->id == profile_id) {
        ssl->s3->srtp_profile = server_profile;
        return true;
      }
    }
  }

  return true;
}